

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BinaryExpression<bool,_(Catch::Internal::Operator)0,_bool>::reconstructExpression
          (BinaryExpression<bool,_(Catch::Internal::Operator)0,_bool> *this,string *dest)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  string rhs;
  string lhs;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  pcVar3 = "false";
  pcVar2 = "false";
  if ((ulong)this->m_lhs != 0) {
    pcVar2 = "true";
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar2,pcVar2 + ((ulong)this->m_lhs ^ 5));
  if ((ulong)this->m_rhs != 0) {
    pcVar3 = "true";
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,pcVar3,pcVar3 + ((ulong)this->m_rhs ^ 5));
  if (((ulong)(local_68 + local_48) < 0x28) &&
     (lVar1 = std::__cxx11::string::find((char)&local_50,10), lVar1 == -1)) {
    std::__cxx11::string::find((char)&local_70,10);
  }
  std::__cxx11::string::reserve((ulong)dest);
  std::__cxx11::string::_M_assign((string *)dest);
  std::__cxx11::string::push_back((char)dest);
  std::__cxx11::string::append((char *)dest);
  std::__cxx11::string::push_back((char)dest);
  std::__cxx11::string::_M_append((char *)dest,(ulong)local_70);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

virtual void reconstructExpression( std::string& dest ) const CATCH_OVERRIDE {
        std::string lhs = Catch::toString( m_lhs );
        std::string rhs = Catch::toString( m_rhs );
        char delim = lhs.size() + rhs.size() < 40 &&
                     lhs.find('\n') == std::string::npos &&
                     rhs.find('\n') == std::string::npos ? ' ' : '\n';
        dest.reserve( 7 + lhs.size() + rhs.size() );
                   // 2 for spaces around operator
                   // 2 for operator
                   // 2 for parentheses (conditionally added later)
                   // 1 for negation (conditionally added later)
        dest = lhs;
        dest += delim;
        dest += Internal::OperatorTraits<Op>::getName();
        dest += delim;
        dest += rhs;
    }